

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

ProcessorProperty * __thiscall soul::heart::Parser::parseProcessorProperty(Parser *this)

{
  Property PVar1;
  Module *pMVar2;
  ProcessorProperty *pPVar3;
  Property property;
  CodeLocation pos;
  Property local_b4;
  CodeLocation local_b0;
  string local_a0;
  CompileMessage local_80;
  CompileMessage local_48;
  
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x29da52);
  local_b0.sourceCode.object =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.sourceCode.object;
  if (local_b0.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_b0.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_b0.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_b0.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  readGeneralIdentifier_abi_cxx11_(&local_a0,this);
  PVar1 = ProcessorProperty::getPropertyFromName(&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_b4 = PVar1;
  if (PVar1 != none) {
    pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
    if (pMVar2->moduleType != namespaceModule) {
      pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
      pPVar3 = Module::
               allocate<soul::heart::ProcessorProperty,soul::CodeLocation&,soul::heart::ProcessorProperty::Property&>
                         (pMVar2,&local_b0,&local_b4);
      RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_b0.sourceCode);
      return pPVar3;
    }
    Errors::processorPropertyUsedOutsideDecl<>();
    CodeLocation::throwError(&local_b0,&local_80);
  }
  Errors::unknownProperty<>();
  CodeLocation::throwError(&local_b0,&local_48);
}

Assistant:

heart::ProcessorProperty& parseProcessorProperty()
    {
        expect (HEARTOperator::dot);
        auto pos = location;
        auto property = heart::ProcessorProperty::getPropertyFromName (readGeneralIdentifier());

        if (property == heart::ProcessorProperty::Property::none)
            pos.throwError (Errors::unknownProperty());

        if (module->isNamespace())
            pos.throwError (Errors::processorPropertyUsedOutsideDecl());

        return module->allocate<heart::ProcessorProperty> (pos, property);
    }